

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

void __thiscall CLayer::GetAdjGrid(CLayer *this)

{
  int iVar1;
  CDesign *pCVar2;
  CGrid *pCVar3;
  int local_18;
  int local_14;
  int j;
  int i;
  CLayer *this_local;
  
  local_14 = 0;
  do {
    pCVar2 = CObject::GetDesign();
    iVar1 = CBBox::W(&pCVar2->super_CBBox);
    if (iVar1 <= local_14) {
      return;
    }
    local_18 = 0;
    while( true ) {
      pCVar2 = CObject::GetDesign();
      iVar1 = CBBox::H(&pCVar2->super_CBBox);
      if (iVar1 <= local_18) break;
      pCVar3 = GetGrid(this,local_14,local_18);
      if (pCVar3 == (CGrid *)0x0) {
        __assert_fail("GetGrid(i,j)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.cpp"
                      ,0x192,"void CLayer::GetAdjGrid()");
      }
      pCVar3 = GetGrid(this,local_14,local_18);
      CGrid::GetAdjGrid(pCVar3,0);
      local_18 = local_18 + 1;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void CLayer::GetAdjGrid()
{
	for (int i=0;i<GetDesign()->W();++i)
		for (int j=0;j<GetDesign()->H();++j)
		{
			assert(GetGrid(i,j));
			GetGrid(i,j)->GetAdjGrid(0);
		}
}